

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O2

EVP_MD * EVP_get_digestbyobj(ASN1_OBJECT *obj)

{
  EVP_MD *pEVar1;
  uint8_t *puVar2;
  CBS cbs;
  CBS local_20;
  
  if (obj->nid != 0) {
    pEVar1 = EVP_get_digestbynid(obj->nid);
    return pEVar1;
  }
  puVar2 = OBJ_get0_data(obj);
  local_20.len = OBJ_length(obj);
  local_20.data = puVar2;
  pEVar1 = cbs_to_md(&local_20);
  return pEVar1;
}

Assistant:

const EVP_MD *EVP_get_digestbyobj(const ASN1_OBJECT *obj) {
  // Handle objects with no corresponding OID. Note we don't use |OBJ_obj2nid|
  // here to avoid pulling in the OID table.
  if (obj->nid != NID_undef) {
    return EVP_get_digestbynid(obj->nid);
  }

  CBS cbs;
  CBS_init(&cbs, OBJ_get0_data(obj), OBJ_length(obj));
  return cbs_to_md(&cbs);
}